

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_movec_32_rc(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((m68ki_cpu.cpu_type & 0x3fc) == 0) goto switchD_0032ebff_default;
  if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
    return;
  }
  uVar3 = m68ki_read_imm_16();
  uVar1 = m68ki_cpu.dar[0xf];
  switch(uVar3 & 0xfff) {
  case 0:
    m68ki_cpu.sfc = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c)) & 7;
    break;
  case 1:
    m68ki_cpu.dfc = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c)) & 7;
    break;
  case 2:
    if ((m68ki_cpu.cpu_type & 0x3f8) == 0) goto switchD_0032ebff_default;
    uVar4 = (ulong)(uVar3 >> 10 & 0x3c);
    if ((m68ki_cpu.cpu_type & 0x380) == 0) {
      uVar2 = *(uint *)((long)m68ki_cpu.dar + uVar4);
      if ((m68ki_cpu.cpu_type & 0x60) == 0) {
        m68ki_cpu.cacr = uVar2 & 0xf;
      }
      else {
        m68ki_cpu.cacr = uVar2 & 0xff1f;
      }
    }
    else {
      m68ki_cpu.cacr = *(uint *)((long)m68ki_cpu.dar + uVar4);
    }
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
switchD_0032ebff_caseD_805:
    if ((m68ki_cpu.cpu_type & 0x380) == 0) {
switchD_0032ebff_default:
      m68ki_exception_illegal();
      return;
    }
    break;
  default:
    switch(uVar3 & 0xfff) {
    case 0x800:
      m68ki_cpu.sp[0] = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
      break;
    case 0x801:
      m68ki_cpu.vbr = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
      break;
    case 0x802:
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) goto switchD_0032ebff_default;
      m68ki_cpu.caar = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
      break;
    case 0x803:
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) goto switchD_0032ebff_default;
      uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
      if (m68ki_cpu.m_flag == 0) {
        m68ki_cpu.sp[6] = uVar1;
        return;
      }
      break;
    case 0x804:
      if ((m68ki_cpu.cpu_type & 0x3f8) == 0) goto switchD_0032ebff_default;
      uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
      if (m68ki_cpu.m_flag != 0) {
        m68ki_cpu.sp[4] = uVar1;
        return;
      }
      break;
    case 0x805:
    case 0x806:
    case 0x807:
      goto switchD_0032ebff_caseD_805;
    default:
      goto switchD_0032ebff_default;
    }
  }
  m68ki_cpu.dar[0xf] = uVar1;
  return;
}

Assistant:

static void m68k_op_movec_32_rc(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();

			m68ki_trace_t0();		   /* auto-disable (see m68kcpu.h) */
			switch (word2 & 0xfff)
			{
			case 0x000:			   /* SFC */
				REG_SFC = REG_DA[(word2 >> 12) & 15] & 7;
				return;
			case 0x001:			   /* DFC */
				REG_DFC = REG_DA[(word2 >> 12) & 15] & 7;
				return;
			case 0x002:			   /* CACR */
				/* Only EC020 and later have CACR */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					/* 68030 can write all bits except 5-7, 040 can write all */
					if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
					{
						REG_CACR = REG_DA[(word2 >> 12) & 15];
					}
					else if (CPU_TYPE_IS_030_PLUS(CPU_TYPE))
					{
						REG_CACR = REG_DA[(word2 >> 12) & 15] & 0xff1f;
					}
					else
					{
						REG_CACR = REG_DA[(word2 >> 12) & 15] & 0x0f;
					}
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x800:			   /* USP */
				REG_USP = REG_DA[(word2 >> 12) & 15];
				return;
			case 0x801:			   /* VBR */
				REG_VBR = REG_DA[(word2 >> 12) & 15];
				return;
			case 0x802:			   /* CAAR */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					REG_CAAR = REG_DA[(word2 >> 12) & 15];
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x803:			   /* MSP */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					/* we are in supervisor mode so just check for M flag */
					if(!FLAG_M)
					{
						REG_MSP = REG_DA[(word2 >> 12) & 15];
						return;
					}
					REG_SP = REG_DA[(word2 >> 12) & 15];
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x804:			   /* ISP */
				if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
				{
					if(!FLAG_M)
					{
						REG_SP = REG_DA[(word2 >> 12) & 15];
						return;
					}
					REG_ISP = REG_DA[(word2 >> 12) & 15];
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x003:			/* TC */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x004:			/* ITT0 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x005:			/* ITT1 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x006:			/* DTT0 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x007:			/* DTT1 */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x805:			/* MMUSR */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x806:			/* URP */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			case 0x807:			/* SRP */
				if (CPU_TYPE_IS_040_PLUS(CPU_TYPE))
				{
					/* TODO */
					return;
				}
				m68ki_exception_illegal();
				return;
			default:
				m68ki_exception_illegal();
				return;
			}
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}